

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O2

optional<pbrt::LightLeSample> * __thiscall
pbrt::DiffuseAreaLight::SampleLe
          (optional<pbrt::LightLeSample> *__return_storage_ptr__,DiffuseAreaLight *this,Point2f u1,
          Point2f u2,SampledWavelengths *lambda,Float time)

{
  undefined1 auVar1 [16];
  ShapeSample *pSVar2;
  ShapeSample *pSVar3;
  undefined1 auVar4 [16];
  undefined8 uVar7;
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  float fVar9;
  undefined1 in_register_00001248 [56];
  undefined1 auVar10 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  Vector3f VVar17;
  Point3f p;
  Vector3f w;
  SampledSpectrum SVar18;
  optional<pbrt::ShapeSample> ss;
  Frame nFrame;
  Tuple2<pbrt::Point2,_float> local_200;
  undefined1 local_1f8 [16];
  float local_1dc;
  undefined1 local_1d8 [16];
  Tuple3<pbrt::Vector3,_float> local_1c0;
  SampledSpectrum local_1b0;
  optional<pbrt::ShapeSample> local_1a0;
  Frame local_13c;
  LightLeSample local_118;
  RayDifferential local_80;
  undefined1 auVar8 [56];
  undefined1 auVar11 [64];
  undefined1 auVar15 [60];
  undefined1 auVar16 [56];
  
  auVar10._8_56_ = in_register_00001248;
  auVar10._0_8_ = u2.super_Tuple2<pbrt::Point2,_float>;
  local_1f8._0_4_ = time;
  local_200 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar10._0_16_);
  ShapeHandle::Sample(&local_1a0,&this->shape,u1);
  auVar15 = auVar10._4_60_;
  if (local_1a0.set != false) {
    pSVar2 = pstd::optional<pbrt::ShapeSample>::value(&local_1a0);
    uVar7 = 0;
    (pSVar2->intr).time = (Float)local_1f8._0_4_;
    pSVar2 = pstd::optional<pbrt::ShapeSample>::value(&local_1a0);
    (pSVar2->intr).mediumInterface = &(this->super_LightBase).mediumInterface;
    if (this->twoSided == true) {
      if (0.5 <= local_200.x) {
        auVar10 = ZEXT464(0x3f7fffff);
        auVar4 = vminss_avx(auVar10._0_16_,ZEXT416((uint)(local_200.x + -0.5 + local_200.x + -0.5)))
        ;
        uVar7 = auVar4._8_8_;
        local_200.x = auVar4._0_4_;
        VVar17 = SampleCosineHemisphere((Point2f *)&local_200);
        auVar13._4_60_ = auVar10._4_60_;
        auVar13._0_4_ = VVar17.super_Tuple3<pbrt::Vector3,_float>.z;
        local_1f8._0_8_ = VVar17.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar4._8_4_ = 0x80000000;
        auVar4._0_8_ = 0x8000000080000000;
        auVar4._12_4_ = 0x80000000;
        local_1d8 = vxorps_avx512vl(auVar13._0_16_,auVar4);
      }
      else {
        auVar10 = ZEXT464(0x3f7fffff);
        auVar4 = vminss_avx(auVar10._0_16_,ZEXT416((uint)(local_200.x + local_200.x)));
        uVar7 = auVar4._8_8_;
        local_200.x = auVar4._0_4_;
        VVar17 = SampleCosineHemisphere((Point2f *)&local_200);
        auVar11._4_60_ = auVar10._4_60_;
        auVar11._0_4_ = VVar17.super_Tuple3<pbrt::Vector3,_float>.z;
        local_1d8 = auVar11._0_16_;
        local_1f8._0_8_ = VVar17.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      }
      local_1f8._8_8_ = uVar7;
      auVar1._8_4_ = 0x7fffffff;
      auVar1._0_8_ = 0x7fffffff7fffffff;
      auVar1._12_4_ = 0x7fffffff;
      auVar4 = vandps_avx512vl(local_1d8,auVar1);
      fVar9 = auVar4._0_4_ * 0.31830987 * 0.5;
    }
    else {
      VVar17 = SampleCosineHemisphere((Point2f *)&local_200);
      auVar12._0_4_ = VVar17.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar12._4_60_ = auVar15;
      local_1f8._8_8_ = uVar7;
      local_1f8._0_8_ = VVar17.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      local_1d8 = auVar12._0_16_;
      fVar9 = auVar12._0_4_ * 0.31830987;
    }
    if ((fVar9 != 0.0) || (NAN(fVar9))) {
      local_1dc = fVar9;
      pSVar2 = pstd::optional<pbrt::ShapeSample>::value(&local_1a0);
      Frame::FromZ(&local_13c,(Vector3f)(pSVar2->intr).n.super_Tuple3<pbrt::Normal3,_float>);
      auVar4 = local_1f8;
      VVar17.super_Tuple3<pbrt::Vector3,_float>.z = local_1d8._0_4_;
      VVar17.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_1f8._0_4_;
      VVar17.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_1f8._4_4_;
      auVar16 = ZEXT856(local_1d8._8_8_);
      auVar8 = ZEXT856((ulong)local_1f8._8_8_);
      local_1f8 = auVar4;
      VVar17 = Frame::FromLocal(&local_13c,VVar17);
      local_1c0.z = VVar17.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar5._0_8_ = VVar17.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar5._8_56_ = auVar8;
      local_1f8 = auVar5._0_16_;
      local_1c0._0_8_ = vmovlps_avx(local_1f8);
      local_1d8._0_4_ = local_1c0.z;
      p = Interaction::p(&pSVar2->intr);
      auVar4 = local_1f8;
      w.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_1d8._0_4_;
      w.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_1f8._0_4_;
      w.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_1f8._4_4_;
      local_1f8 = auVar4;
      SVar18 = L(this,p,(Normal3f)(pSVar2->intr).n.super_Tuple3<pbrt::Normal3,_float>,
                 (Point2f)(pSVar2->intr).uv.super_Tuple2<pbrt::Point2,_float>,w,lambda);
      auVar14._0_8_ = SVar18.values.values._8_8_;
      auVar14._8_56_ = auVar16;
      auVar6._0_8_ = SVar18.values.values._0_8_;
      auVar6._8_56_ = auVar8;
      local_1b0.values.values = (array<float,_4>)vmovlhps_avx(auVar6._0_16_,auVar14._0_16_);
      Interaction::SpawnRay(&local_80,&pSVar2->intr,(Vector3f *)&local_1c0);
      pSVar3 = pstd::optional<pbrt::ShapeSample>::value(&local_1a0);
      LightLeSample::LightLeSample
                (&local_118,&local_1b0,&local_80.super_Ray,&pSVar2->intr,pSVar3->pdf,local_1dc);
      pstd::optional<pbrt::LightLeSample>::optional(__return_storage_ptr__,&local_118);
      pstd::optional<pbrt::Interaction>::~optional(&local_118.intr);
      goto LAB_002fae3c;
    }
  }
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x60) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x68) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x70) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x78) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x80) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x88) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x90) = 0;
  *(undefined8 *)&__return_storage_ptr__->set = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x40) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x50) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x58) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x60) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x68) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x70) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x78) = 0;
  (__return_storage_ptr__->optionalValue).__align = (anon_struct_8_0_00000001_for___align)0x0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
LAB_002fae3c:
  pstd::optional<pbrt::ShapeSample>::~optional(&local_1a0);
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<LightLeSample> DiffuseAreaLight::SampleLe(Point2f u1, Point2f u2,
                                                         SampledWavelengths &lambda,
                                                         Float time) const {
    // Sample a point on the area light's _Shape_
    pstd::optional<ShapeSample> ss = shape.Sample(u1);
    if (!ss)
        return {};
    ss->intr.time = time;
    ss->intr.mediumInterface = &mediumInterface;

    // Sample a cosine-weighted outgoing direction _w_ for area light
    Vector3f w;
    Float pdfDir;
    if (twoSided) {
        // Choose side of surface and sample cosine-weighted outgoing direction
        if (u2[0] < 0.5f) {
            u2[0] = std::min(u2[0] * 2, OneMinusEpsilon);
            w = SampleCosineHemisphere(u2);
        } else {
            u2[0] = std::min((u2[0] - 0.5f) * 2, OneMinusEpsilon);
            w = SampleCosineHemisphere(u2);
            w.z *= -1;
        }
        pdfDir = 0.5f * CosineHemispherePDF(std::abs(w.z));

    } else {
        w = SampleCosineHemisphere(u2);
        pdfDir = CosineHemispherePDF(w.z);
    }
    if (pdfDir == 0)
        return {};

    // Return _LightLeSample_ for ray leaving area light
    const Interaction &intr = ss->intr;
    Frame nFrame = Frame::FromZ(intr.n);
    w = nFrame.FromLocal(w);
    return LightLeSample(L(intr.p(), intr.n, intr.uv, w, lambda), intr.SpawnRay(w), intr,
                         ss->pdf, pdfDir);
}